

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid_soa.cpp
# Opt level: O1

pair<embree::NodeRefPtr<4>,_embree::LBBox<embree::Vec3fa>_> * __thiscall
embree::sse2::GridSOA::buildMBlurBVH
          (pair<embree::NodeRefPtr<4>,_embree::LBBox<embree::Vec3fa>_> *__return_storage_ptr__,
          GridSOA *this,size_t time,GridRange *range,size_t *allocator)

{
  uint uVar1;
  size_t sVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  uint v_size;
  uint uVar8;
  int iVar9;
  uint *puVar10;
  uint uVar11;
  uint v_size_1;
  uint uVar12;
  ulong uVar13;
  uint u_size;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  GridRange *range_00;
  uint uVar17;
  float fVar18;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar19;
  undefined4 in_XMM2_Db;
  undefined4 in_XMM2_Dd;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar22;
  float fVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar33;
  pair<embree::NodeRefPtr<4>,_embree::LBBox<embree::Vec3fa>_> node_bounds;
  GridRange local_f8;
  uint local_e8 [14];
  char *local_b0;
  float local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_98;
  pair<embree::NodeRefPtr<4>,_embree::LBBox<embree::Vec3fa>_> local_88;
  
  uVar7 = range->u_start;
  uVar1 = range->u_end;
  if ((uVar1 - uVar7) + 1 < 4) {
    uVar6 = range->v_end;
    uVar17 = range->v_start;
    uVar16 = (ulong)uVar17;
    if ((uVar6 - uVar17) + 1 < 4) {
      uVar11 = this->width;
      uVar12 = this->dim_offset;
      lVar5 = uVar16 * uVar11;
      aVar33 = _DAT_01feb9f0;
      aVar26 = _DAT_01feba00;
      if (uVar17 <= uVar6) {
        lVar3 = this->gridBytes * time + (ulong)this->gridOffset + 0x30;
        iVar9 = uVar17 * uVar11;
        uVar8 = uVar7;
        uVar13 = uVar16;
        do {
          for (; uVar8 <= uVar1; uVar8 = uVar8 + 1) {
            uVar15 = (ulong)(uVar8 + iVar9);
            auVar20._4_4_ =
                 *(undefined4 *)(this->data + uVar15 * 4 + (ulong)uVar12 * 4 + lVar3 + -0x30);
            auVar20._0_4_ = *(undefined4 *)(this->data + uVar15 * 4 + lVar3 + -0x30);
            auVar20._8_4_ =
                 *(undefined4 *)(this->data + uVar15 * 4 + (ulong)(uVar12 * 2) * 4 + lVar3 + -0x30);
            auVar20._12_4_ = 0;
            aVar33.m128 = (__m128)minps(aVar33.m128,auVar20);
            aVar26.m128 = (__m128)maxps(aVar26.m128,auVar20);
          }
          uVar14 = (int)uVar13 + 1;
          uVar13 = (ulong)uVar14;
          iVar9 = iVar9 + uVar11;
          uVar8 = uVar7;
        } while (uVar14 <= uVar6);
      }
      aVar19 = _DAT_01feba00;
      aVar22 = _DAT_01feb9f0;
      if (uVar17 <= uVar6) {
        lVar3 = (time + 1) * (ulong)this->gridBytes + (ulong)this->gridOffset + 0x30;
        iVar9 = uVar17 * uVar11;
        uVar17 = uVar7;
        do {
          for (; uVar17 <= uVar1; uVar17 = uVar17 + 1) {
            uVar13 = (ulong)(iVar9 + uVar17);
            auVar21._4_4_ =
                 *(undefined4 *)(this->data + uVar13 * 4 + (ulong)uVar12 * 4 + lVar3 + -0x30);
            auVar21._0_4_ = *(undefined4 *)(this->data + uVar13 * 4 + lVar3 + -0x30);
            auVar21._8_4_ =
                 *(undefined4 *)(this->data + uVar13 * 4 + (ulong)(uVar12 * 2) * 4 + lVar3 + -0x30);
            auVar21._12_4_ = 0;
            aVar22.m128 = (__m128)minps(aVar22.m128,auVar21);
            aVar19.m128 = (__m128)maxps(aVar19.m128,auVar21);
          }
          uVar8 = (int)uVar16 + 1;
          uVar16 = (ulong)uVar8;
          iVar9 = iVar9 + uVar11;
          uVar17 = uVar7;
        } while (uVar8 <= uVar6);
      }
      (__return_storage_ptr__->first).ptr = (lVar5 + (ulong)uVar7) * 0x10 + 0x18;
      (__return_storage_ptr__->second).bounds0.lower.field_0 = aVar33;
      (__return_storage_ptr__->second).bounds0.upper.field_0 = aVar26;
      (__return_storage_ptr__->second).bounds1.lower.field_0 = aVar22;
      goto LAB_00e3d1b4;
    }
  }
  sVar2 = *allocator;
  local_b0 = this->data + sVar2;
  *allocator = sVar2 + 0xe0;
  aVar33 = _DAT_01feb9f0;
  *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(this[2].data + (sVar2 - 0x10)) = _DAT_01feb9f0;
  *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(this[2].data + (sVar2 - 0x30)) = aVar33;
  *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(this[1].data + (sVar2 - 0x18)) = aVar33;
  aVar19 = _DAT_01feba00;
  *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(this[2].data + sVar2) = _DAT_01feba00;
  *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(this[2].data + (sVar2 - 0x20)) = aVar19;
  *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(this[1].data + (sVar2 - 8)) = aVar19;
  *(undefined8 *)(this[3].data + (sVar2 - 0x28)) = 0;
  *(undefined8 *)(this[3].data + (sVar2 - 0x20)) = 0;
  *(undefined8 *)(this[3].data + (sVar2 - 0x18)) = 0;
  *(undefined8 *)(this[3].data + (sVar2 - 0x10)) = 0;
  *(undefined8 *)(this[3].data + (sVar2 - 8)) = 0;
  *(undefined8 *)(this[3].data + sVar2) = 0;
  *(undefined8 *)(this[4].data + (sVar2 - 0x30)) = 0;
  *(undefined8 *)(this[4].data + (sVar2 - 0x28)) = 0;
  *(undefined8 *)(this[4].data + (sVar2 - 0x20)) = 0;
  *(undefined8 *)(this[4].data + (sVar2 - 0x18)) = 0;
  *(undefined8 *)(this[4].data + (sVar2 - 0x10)) = 0;
  *(undefined8 *)(this[4].data + (sVar2 - 8)) = 0;
  lVar5 = 0;
  do {
    *(undefined8 *)(local_b0 + lVar5 * 8) = 8;
    *(undefined8 *)(local_b0 + lVar5 * 8 + 8) = 8;
    lVar5 = lVar5 + 2;
  } while (lVar5 != 4);
  local_f8.u_start = range->u_start;
  uVar7 = range->u_end;
  uVar1 = range->v_end;
  local_f8.v_start = range->v_start;
  if ((uVar7 - local_f8.u_start) + 1 < (uVar1 - local_f8.v_start) + 1) {
    uVar6 = local_f8.v_start + uVar1 >> 1;
    uVar17 = local_f8.u_start;
    uVar11 = uVar7;
    uVar12 = uVar6;
  }
  else {
    uVar17 = local_f8.u_start + uVar7 >> 1;
    uVar6 = local_f8.v_start;
    uVar11 = uVar17;
    uVar12 = uVar1;
  }
  uVar14 = (uVar11 - local_f8.u_start) + 1;
  uVar8 = (uVar12 - local_f8.v_start) + 1;
  local_f8.u_end = uVar11;
  local_f8.v_end = uVar12;
  if ((uVar8 | uVar14) < 4) {
    iVar9 = 1;
  }
  else {
    if (uVar14 < uVar8) {
      local_e8[2] = uVar12 + local_f8.v_start >> 1;
      local_f8.v_end = local_e8[2];
      local_e8[0] = local_f8.u_start;
    }
    else {
      local_f8.u_end = uVar11 + local_f8.u_start >> 1;
      local_e8[0] = local_f8.u_end;
      local_e8[2] = local_f8.v_start;
    }
    iVar9 = 2;
    local_e8[1] = uVar11;
    local_e8[3] = uVar12;
  }
  uVar11 = (uVar7 - uVar17) + 1;
  uVar12 = (uVar1 - uVar6) + 1;
  uVar16 = (ulong)(uint)(iVar9 << 4);
  puVar10 = (uint *)((long)&local_f8.u_start + uVar16);
  if ((uVar12 | uVar11) < 4) {
    *puVar10 = uVar17;
    *(uint *)((long)local_e8 + (uVar16 - 0xc)) = uVar7;
    *(uint *)((long)local_e8 + (uVar16 - 8)) = uVar6;
    *(uint *)((long)local_e8 + (uVar16 - 4)) = uVar1;
    iVar4 = 1;
  }
  else {
    *puVar10 = uVar17;
    *(uint *)((long)local_e8 + (uVar16 - 0xc)) = uVar7;
    *(uint *)((long)local_e8 + (uVar16 - 8)) = uVar6;
    *(uint *)((long)local_e8 + (uVar16 - 4)) = uVar1;
    *(uint *)((long)local_e8 + uVar16) = uVar17;
    *(uint *)((long)local_e8 + uVar16 + 4) = uVar7;
    *(uint *)((long)local_e8 + uVar16 + 8) = uVar6;
    *(uint *)((long)local_e8 + uVar16 + 0xc) = uVar1;
    if (uVar11 < uVar12) {
      uVar7 = uVar6 + uVar1 >> 1;
      *(uint *)((long)local_e8 + (uVar16 - 4)) = uVar7;
      *(uint *)((long)local_e8 + uVar16 + 8) = uVar7;
    }
    else {
      uVar7 = uVar17 + uVar7 >> 1;
      *(uint *)((long)local_e8 + (uVar16 - 0xc)) = uVar7;
      *(uint *)((long)local_e8 + uVar16) = uVar7;
    }
    iVar4 = 2;
  }
  range_00 = &local_f8;
  uVar16 = 0;
  aVar26 = aVar19;
  local_98 = aVar33;
  do {
    fVar18 = (float)(this->time_steps - 1);
    local_a8 = (float)time / fVar18;
    uStack_a0 = 0;
    uStack_a4 = in_XMM2_Db;
    uStack_9c = in_XMM2_Dd;
    buildMBlurBVH(&local_88,this,time,range_00,allocator);
    *(size_t *)(this->data + uVar16 * 8 + sVar2) = local_88.first.ptr;
    fVar23 = 1.0 / ((float)(time + 1) / fVar18 - local_a8);
    fVar32 = -local_a8 * fVar23;
    fVar18 = 1.0 - fVar32;
    auVar25._0_4_ =
         local_88.second.bounds0.lower.field_0._0_4_ * fVar18 +
         local_88.second.bounds1.lower.field_0._0_4_ * fVar32;
    auVar25._4_4_ =
         local_88.second.bounds0.lower.field_0._4_4_ * fVar18 +
         local_88.second.bounds1.lower.field_0._4_4_ * fVar32;
    auVar25._8_4_ =
         local_88.second.bounds0.lower.field_0._8_4_ * fVar18 +
         local_88.second.bounds1.lower.field_0._8_4_ * fVar32;
    auVar25._12_4_ =
         local_88.second.bounds0.lower.field_0._12_4_ * fVar18 +
         local_88.second.bounds1.lower.field_0._12_4_ * fVar32;
    auVar28._0_4_ =
         fVar18 * local_88.second.bounds0.upper.field_0._0_4_ +
         fVar32 * local_88.second.bounds1.upper.field_0._0_4_;
    auVar28._4_4_ =
         fVar18 * local_88.second.bounds0.upper.field_0._4_4_ +
         fVar32 * local_88.second.bounds1.upper.field_0._4_4_;
    auVar28._8_4_ =
         fVar18 * local_88.second.bounds0.upper.field_0._8_4_ +
         fVar32 * local_88.second.bounds1.upper.field_0._8_4_;
    auVar28._12_4_ =
         fVar18 * local_88.second.bounds0.upper.field_0._12_4_ +
         fVar32 * local_88.second.bounds1.upper.field_0._12_4_;
    local_98.m128 = (__m128)minps(local_98.m128,local_88.second.bounds1.lower.field_0);
    aVar33.m128 = (__m128)minps(aVar33.m128,local_88.second.bounds0.lower.field_0);
    fVar23 = (1.0 - local_a8) * fVar23;
    fVar18 = 1.0 - fVar23;
    auVar27._0_4_ =
         local_88.second.bounds0.lower.field_0._0_4_ * fVar18 +
         local_88.second.bounds1.lower.field_0._0_4_ * fVar23;
    auVar27._4_4_ =
         local_88.second.bounds0.lower.field_0._4_4_ * fVar18 +
         local_88.second.bounds1.lower.field_0._4_4_ * fVar23;
    auVar27._8_4_ =
         local_88.second.bounds0.lower.field_0._8_4_ * fVar18 +
         local_88.second.bounds1.lower.field_0._8_4_ * fVar23;
    auVar27._12_4_ =
         local_88.second.bounds0.lower.field_0._12_4_ * fVar18 +
         local_88.second.bounds1.lower.field_0._12_4_ * fVar23;
    auVar24._0_4_ =
         fVar18 * local_88.second.bounds0.upper.field_0._0_4_ +
         fVar23 * local_88.second.bounds1.upper.field_0._0_4_;
    auVar24._4_4_ =
         fVar18 * local_88.second.bounds0.upper.field_0._4_4_ +
         fVar23 * local_88.second.bounds1.upper.field_0._4_4_;
    auVar24._8_4_ =
         fVar18 * local_88.second.bounds0.upper.field_0._8_4_ +
         fVar23 * local_88.second.bounds1.upper.field_0._8_4_;
    auVar24._12_4_ =
         fVar18 * local_88.second.bounds0.upper.field_0._12_4_ +
         fVar23 * local_88.second.bounds1.upper.field_0._12_4_;
    auVar20 = minps(auVar25,_DAT_01ff1820);
    auVar21 = maxps(auVar28,_DAT_01ff1810);
    auVar28 = minps(auVar27,_DAT_01ff1820);
    auVar25 = maxps(auVar24,_DAT_01ff1810);
    fVar18 = auVar20._0_4_ - ABS(auVar20._0_4_) * 4.7683716e-07;
    fVar23 = auVar20._4_4_ - ABS(auVar20._4_4_) * 4.7683716e-07;
    fVar32 = auVar20._8_4_ - ABS(auVar20._8_4_) * 4.7683716e-07;
    fVar29 = ABS(auVar21._0_4_) * 4.7683716e-07 + auVar21._0_4_;
    fVar30 = ABS(auVar21._4_4_) * 4.7683716e-07 + auVar21._4_4_;
    fVar31 = ABS(auVar21._8_4_) * 4.7683716e-07 + auVar21._8_4_;
    *(float *)(this[1].data + uVar16 * 4 + sVar2 + -0x18) = fVar18;
    *(float *)(this[2].data + uVar16 * 4 + sVar2 + -0x30) = fVar23;
    *(float *)(this[2].data + uVar16 * 4 + sVar2 + -0x10) = fVar32;
    *(float *)(this[1].data + uVar16 * 4 + sVar2 + -8) = fVar29;
    *(float *)(this[2].data + uVar16 * 4 + sVar2 + -0x20) = fVar30;
    *(float *)(this[2].data + uVar16 * 4 + sVar2) = fVar31;
    *(float *)(this[3].data + uVar16 * 4 + sVar2 + -0x28) =
         (auVar28._0_4_ - ABS(auVar28._0_4_) * 4.7683716e-07) - fVar18;
    *(float *)(this[3].data + uVar16 * 4 + sVar2 + -8) =
         (auVar28._4_4_ - ABS(auVar28._4_4_) * 4.7683716e-07) - fVar23;
    *(float *)(this[4].data + uVar16 * 4 + sVar2 + -0x20) =
         (auVar28._8_4_ - ABS(auVar28._8_4_) * 4.7683716e-07) - fVar32;
    *(float *)(this[3].data + uVar16 * 4 + sVar2 + -0x18) =
         (ABS(auVar25._0_4_) * 4.7683716e-07 + auVar25._0_4_) - fVar29;
    *(float *)(this[4].data + uVar16 * 4 + sVar2 + -0x30) =
         (ABS(auVar25._4_4_) * 4.7683716e-07 + auVar25._4_4_) - fVar30;
    in_XMM2_Db = 0;
    in_XMM2_Dd = 0;
    *(float *)(this[4].data + uVar16 * 4 + sVar2 + -0x10) =
         (ABS(auVar25._8_4_) * 4.7683716e-07 + auVar25._8_4_) - fVar31;
    aVar26.m128 = (__m128)maxps(aVar26.m128,local_88.second.bounds0.upper.field_0);
    aVar19.m128 = (__m128)maxps(aVar19.m128,local_88.second.bounds1.upper.field_0);
    uVar16 = uVar16 + 1;
    range_00 = range_00 + 1;
  } while ((uint)(iVar9 + iVar4) != uVar16);
  (__return_storage_ptr__->first).ptr = (ulong)local_b0 | 1;
  (__return_storage_ptr__->second).bounds0.lower.field_0 = aVar33;
  (__return_storage_ptr__->second).bounds0.upper.field_0 = aVar26;
  (__return_storage_ptr__->second).bounds1.lower.field_0 = local_98;
LAB_00e3d1b4:
  (__return_storage_ptr__->second).bounds1.upper.field_0 = aVar19;
  return __return_storage_ptr__;
}

Assistant:

std::pair<BVH4::NodeRef,LBBox3fa> GridSOA::buildMBlurBVH(size_t time, const GridRange& range, size_t& allocator)
    {
      /*! create leaf node */
      if (unlikely(range.hasLeafSize()))
      {
        /* we store index of first subgrid vertex as leaf node */
        BVH4::NodeRef curNode = BVH4::encodeTypedLeaf(encodeLeaf(range.u_start,range.v_start),0);

        /* return bounding box */
        const BBox3fa b0 = calculateBounds(time+0,range);
        const BBox3fa b1 = calculateBounds(time+1,range);
        return std::make_pair(curNode,LBBox3fa(b0,b1));
      }
      
      /* create internal node */
      else 
      {
        /* allocate new bvh4 node */
        BVH4::AABBNodeMB* node = (BVH4::AABBNodeMB *)&bvhData()[allocator];
        allocator += sizeof(BVH4::AABBNodeMB);
        node->clear();
        
        /* split range */
        GridRange r[4];
        const unsigned children = range.splitIntoSubRanges(r);
      
        /* recurse into subtrees */
        LBBox3fa bounds(empty);
        for (unsigned i=0; i<children; i++)
        {
          const BBox1f time_range(float(time+0)/float(time_steps-1),
                                  float(time+1)/float(time_steps-1));
          std::pair<BVH4::NodeRef,LBBox3fa> node_bounds = buildMBlurBVH(time, r[i], allocator);
          node->setRef(i,node_bounds.first);
          node->setBounds(i,node_bounds.second.global(time_range));
          bounds.extend(node_bounds.second);
        }
        assert(is_finite(bounds.bounds0));
        assert(is_finite(bounds.bounds1));
        
        return std::make_pair(BVH4::encodeNode(node),bounds);
      }
    }